

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

int setsockopt_txtime(int fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  int err_1;
  int err;
  int ret;
  socklen_t vallen;
  int so_mark_val_read;
  sock_txtime so_txtime_val_read;
  sock_txtime so_txtime_val;
  socklen_t local_20;
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  int local_10 [3];
  int local_4;
  
  local_10[0] = clockid;
  local_10[1] = 2;
  local_10[2] = in_EDI;
  iVar1 = setsockopt(in_EDI,1,0x3d,local_10,8);
  if (iVar1 == 0) {
    local_20 = 8;
    iVar1 = getsockopt(local_10[2],1,0x3d,local_18,&local_20);
    if (iVar1 == 0) {
      if ((local_20 == 8) && (iVar1 = memcmp(local_10,local_18,8), iVar1 == 0)) {
        iVar1 = setsockopt(local_10[2],1,0x24,&so_mark_val,4);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          perror("setsockopt() SO_MARK");
          if (iVar1 == 1) {
            fprintf(_stderr,"Run with CAP_NET_ADMIN or as root.\n");
          }
          return -iVar1;
        }
        local_20 = 4;
        iVar1 = getsockopt(local_10[2],1,0x24,local_1c,&local_20);
        if (iVar1 != 0) {
          perror("getsockopt() SO_MARK");
          piVar2 = __errno_location();
          return -*piVar2;
        }
        if ((local_20 == 4) && (iVar1 = memcmp(&so_mark_val,local_1c,4), iVar1 == 0)) {
          return 0;
        }
        perror("getsockopt() SO_MARK: mismatch");
        return -0x16;
      }
      perror("getsockopt() SO_TXTIME: mismatch");
      local_4 = -0x16;
    }
    else {
      perror("getsockopt() SO_TXTIME");
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    perror("setsockopt() SO_TXTIME");
    if (iVar1 == 1) {
      fprintf(_stderr,"Run with CAP_NET_ADMIN or as root.\n");
    }
    local_4 = -iVar1;
  }
  return local_4;
}

Assistant:

static int setsockopt_txtime(int fd)
{
	const struct sock_txtime so_txtime_val = {
		.clockid = clockid,
		.flags = SOF_TXTIME_REPORT_ERRORS,
	};
	struct sock_txtime so_txtime_val_read;
	int so_mark_val_read;
	socklen_t vallen;
	int ret;

	/* SO_TXTIME */

	ret = setsockopt(fd, SOL_SOCKET, SO_TXTIME,
			 &so_txtime_val, sizeof(so_txtime_val));
	if (ret) {
		int err = errno;

		perror("setsockopt() SO_TXTIME");
		if (err == EPERM)
			fprintf(stderr, "Run with CAP_NET_ADMIN or as root.\n");

		return -err;
	};

	vallen = sizeof(so_txtime_val_read);
	ret = getsockopt(fd, SOL_SOCKET, SO_TXTIME,
			 &so_txtime_val_read, &vallen);
	if (ret) {
		perror("getsockopt() SO_TXTIME");
		return -errno;
	};

	if (vallen != sizeof(so_txtime_val) ||
	    memcmp(&so_txtime_val, &so_txtime_val_read, vallen)) {
		perror("getsockopt() SO_TXTIME: mismatch");
		return -EINVAL;
	}

	/* SO_MARK */

	ret = setsockopt(fd, SOL_SOCKET, SO_MARK, &so_mark_val, sizeof(so_mark_val));
	if (ret) {
		int err = errno;

		perror("setsockopt() SO_MARK");
		if (err == EPERM)
			fprintf(stderr, "Run with CAP_NET_ADMIN or as root.\n");

		return -err;
	};

	vallen = sizeof(so_mark_val_read);
	ret = getsockopt(fd, SOL_SOCKET, SO_MARK,
			 &so_mark_val_read, &vallen);
	if (ret) {
		perror("getsockopt() SO_MARK");
		return -errno;
	};

	if (vallen != sizeof(so_mark_val) ||
	    memcmp(&so_mark_val, &so_mark_val_read, vallen)) {
		perror("getsockopt() SO_MARK: mismatch");
		return -EINVAL;
	}

	return 0;
}